

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

void test_is_ipaddr(void)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = ptls_server_name_is_ipaddr("www.google.com");
  _ok(uVar1 ^ 1,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x26);
  uVar1 = ptls_server_name_is_ipaddr("www.google.com.");
  _ok(uVar1 ^ 1,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x27);
  uVar1 = ptls_server_name_is_ipaddr("www");
  _ok(uVar1 ^ 1,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x28);
  uVar1 = ptls_server_name_is_ipaddr("");
  _ok(uVar1 ^ 1,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x29);
  uVar1 = ptls_server_name_is_ipaddr("123");
  _ok(uVar1 ^ 1,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x2a);
  iVar2 = ptls_server_name_is_ipaddr("1.1.1.1");
  _ok(iVar2,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x2b);
  iVar2 = ptls_server_name_is_ipaddr("2001:db8::2:1");
  _ok(iVar2,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x2c);
  return;
}

Assistant:

static void test_is_ipaddr(void)
{
    ok(!ptls_server_name_is_ipaddr("www.google.com"));
    ok(!ptls_server_name_is_ipaddr("www.google.com."));
    ok(!ptls_server_name_is_ipaddr("www"));
    ok(!ptls_server_name_is_ipaddr(""));
    ok(!ptls_server_name_is_ipaddr("123"));
    ok(ptls_server_name_is_ipaddr("1.1.1.1"));
    ok(ptls_server_name_is_ipaddr("2001:db8::2:1"));
}